

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

_Bool bson_iter_init(bson_iter_t *iter,bson_t *bson)

{
  uint8_t *puVar1;
  bson_iter_t *unaff_RBX;
  uint unaff_EBP;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_cold_2();
LAB_001104de:
    bson_iter_init_cold_1();
  }
  else {
    if (bson == (bson_t *)0x0) goto LAB_001104de;
    unaff_EBP = bson->len;
    unaff_RBX = iter;
    if (4 < unaff_EBP) {
      puVar1 = bson_get_data(bson);
      iter->raw = puVar1;
      iter->len = bson->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_001104ce;
    }
  }
  (unaff_RBX->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_RBX->value).value + 0x10) = 0;
  (unaff_RBX->value).value_type = BSON_TYPE_EOD;
  (unaff_RBX->value).padding = 0;
  (unaff_RBX->value).value.v_int64 = 0;
  unaff_RBX->d3 = 0;
  unaff_RBX->d4 = 0;
  unaff_RBX->next_off = 0;
  unaff_RBX->err_off = 0;
  unaff_RBX->type = 0;
  unaff_RBX->key = 0;
  unaff_RBX->d1 = 0;
  unaff_RBX->d2 = 0;
  unaff_RBX->raw = (uint8_t *)0x0;
  unaff_RBX->len = 0;
  unaff_RBX->off = 0;
LAB_001104ce:
  return 4 < unaff_EBP;
}

Assistant:

bool
bson_iter_init (bson_iter_t *iter,  /* OUT */
                const bson_t *bson) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);

   if (BSON_UNLIKELY (bson->len < 5)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = bson_get_data (bson);
   iter->len = bson->len;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}